

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::to_short_string(string *in,size_t max_len,char *out)

{
  char cVar1;
  ulong uVar2;
  char cVar3;
  
  if (max_len != 0) {
    uVar2 = 0;
    do {
      cVar3 = ' ';
      if (uVar2 < in->_M_string_length) {
        cVar1 = (in->_M_dataplus)._M_p[uVar2];
        cVar3 = ' ';
        if (1 < (byte)(cVar1 - 9U)) {
          cVar3 = cVar1;
        }
      }
      out[uVar2] = cVar3;
      uVar2 = uVar2 + 1;
    } while (max_len != uVar2);
  }
  if (max_len < in->_M_string_length) {
    (out + (max_len - 2))[0] = '.';
    (out + (max_len - 2))[1] = '.';
  }
  out[max_len] = '\0';
  return;
}

Assistant:

void to_short_string(string in, size_t max_len, char* out)
{
  for (size_t i = 0; i < max_len; i++)
    out[i] = ((i >= in.length()) || (in[i] == '\n') || (in[i] == '\t')) ? ' ' : in[i];

  if (in.length() > max_len)
  {
    out[max_len - 2] = '.';
    out[max_len - 1] = '.';
  }
  out[max_len] = 0;
}